

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_line(CPState *cp,BCLine hashline)

{
  undefined4 uVar1;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  BCLine newline;
  
  uVar1 = *(undefined4 *)(in_RDI + 8);
  while( true ) {
    bVar2 = false;
    if (*(int *)(in_RDI + 4) != 0x103) {
      bVar2 = *(int *)(in_RDI + 0x58) == in_ESI;
    }
    if (!bVar2) break;
    cp_next((CPState *)0x17a484);
  }
  *(undefined4 *)(in_RDI + 0x58) = uVar1;
  return;
}

Assistant:

static void cp_line(CPState *cp, BCLine hashline)
{
  BCLine newline = cp->val.u32;
  /* TODO: Handle file name and include it in error messages. */
  while (cp->tok != CTOK_EOF && cp->linenumber == hashline)
    cp_next(cp);
  cp->linenumber = newline;
}